

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

long search::go(void)

{
  pointer pMVar1;
  int iVar2;
  ostream *poVar3;
  long extraout_RAX;
  int depth;
  pointer pMVar4;
  SearchInfo *in_RSI;
  Board *in_RDI;
  vector<board::Move,_std::allocator<board::Move>_> pv;
  Move move;
  string local_88;
  PVTable pvtable;
  
  pvtable.map._M_h._M_buckets = &pvtable.map._M_h._M_single_bucket;
  pvtable.map._M_h._M_bucket_count = 1;
  pvtable.map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pvtable.map._M_h._M_element_count = 0;
  pvtable.map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pvtable.map._M_h._M_rehash_policy._M_next_resize = 0;
  pvtable.map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  reset(in_RDI,in_RSI);
  for (depth = 1; in_RSI->depth == -1 || depth <= in_RSI->depth; depth = depth + 1) {
    iVar2 = negamax(-0x7fffffff,0x7ffffffe,depth,in_RDI,in_RSI,&pvtable);
    if (in_RSI->stopped != false) break;
    PVTable::getPV((vector<board::Move,_std::allocator<board::Move>_> *)&local_88,&pvtable,in_RDI);
    std::vector<board::Move,_std::allocator<board::Move>_>::_M_move_assign(&pv,&local_88);
    std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base
              ((_Vector_base<board::Move,_std::allocator<board::Move>_> *)&local_88);
    poVar3 = std::operator<<((ostream *)&std::cout,"info score cp ");
    std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<((ostream *)&std::cout," depth ");
    std::ostream::operator<<(poVar3,depth);
    poVar3 = std::operator<<((ostream *)&std::cout," nodes ");
    std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout," time ");
    utils::getTime();
    std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<((ostream *)&std::cout," pv");
    pMVar1 = pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar4 = pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                  super__Vector_impl_data._M_start; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
      move = *pMVar4;
      poVar3 = std::operator<<((ostream *)&std::cout," ");
      board::Move::getString_abi_cxx11_(&local_88,&move);
      std::operator<<(poVar3,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_start !=
      pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)&std::cout,"bestmove ");
    board::Move::getString_abi_cxx11_
              (&local_88,
               pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
               super__Vector_impl_data._M_start);
    poVar3 = std::operator<<(poVar3,(string *)&local_88);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::_Vector_base<board::Move,_std::allocator<board::Move>_>::~_Vector_base
            (&pv.super__Vector_base<board::Move,_std::allocator<board::Move>_>);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&pvtable);
  return extraout_RAX;
}

Assistant:

void search::go(board::Board& pos, SearchInfo& info)
{
    int score = NEG_INFINITY;
    PVTable pvtable;
    std::vector<board::Move> pv;
    reset(pos, info);
    for (int depth = 1; info.getDepth() == -1 || depth <= info.getDepth(); depth++) {
        score = negamax(NEG_INFINITY, POS_INFINITY, depth, pos, info, pvtable);
        if (info.getStopped()) {
            break;
        }
        pv = pvtable.getPV(pos);
        std::cout << "info score cp " << score;
        std::cout << " depth " << depth;
        std::cout << " nodes " << info.getNodes();
        std::cout << " time " << (utils::getTime() - info.getStartTime());
        std::cout << " pv";
        for (board::Move move : pv) {
            std::cout << " " << move.getString();
        }
        std::cout << std::endl;
    }
    if (!pv.empty()) {
        std::cout << "bestmove " << pv[0].getString() << std::endl;
    }
}